

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O0

int Lpk_FunComputeMinSuppSizeVar
              (Lpk_Fun_t *p,uint **ppTruths,int nTruths,uint **ppCofs,uint uNonDecSupp)

{
  int a;
  int local_50;
  int local_4c;
  int nSuppMaxCur;
  int nSuppMaxMin;
  int nSuppTotalCur;
  int nSuppTotalMin;
  int nSuppSize1;
  int nSuppSize0;
  int VarBest;
  int Var;
  int i;
  uint uNonDecSupp_local;
  uint **ppCofs_local;
  int nTruths_local;
  uint **ppTruths_local;
  Lpk_Fun_t *p_local;
  
  nSuppMaxMin = -1;
  local_4c = -1;
  if (0 < nTruths) {
    nSuppSize1 = -1;
    for (nSuppSize0 = 0; nSuppSize0 < 0x10; nSuppSize0 = nSuppSize0 + 1) {
      if (((p->uSupp & 1 << ((byte)nSuppSize0 & 0x1f)) != 0) &&
         ((uNonDecSupp & 1 << ((byte)nSuppSize0 & 0x1f)) != 0)) {
        local_50 = 0;
        nSuppMaxCur = 0;
        for (VarBest = 0; VarBest < nTruths; VarBest = VarBest + 1) {
          if (nTruths == 1) {
            nSuppTotalMin = Kit_WordCountOnes(p->puSupps[nSuppSize0 << 1]);
            nSuppTotalCur = Kit_WordCountOnes(p->puSupps[nSuppSize0 * 2 + 1]);
          }
          else {
            Kit_TruthCofactor0New
                      (ppCofs[VarBest << 1],ppTruths[VarBest],*(uint *)&p->field_0x8 >> 7 & 0x1f,
                       nSuppSize0);
            Kit_TruthCofactor1New
                      (ppCofs[VarBest * 2 + 1],ppTruths[VarBest],*(uint *)&p->field_0x8 >> 7 & 0x1f,
                       nSuppSize0);
            nSuppTotalMin =
                 Kit_TruthSupportSize(ppCofs[VarBest << 1],*(uint *)&p->field_0x8 >> 7 & 0x1f);
            nSuppTotalCur =
                 Kit_TruthSupportSize(ppCofs[VarBest * 2 + 1],*(uint *)&p->field_0x8 >> 7 & 0x1f);
          }
          a = Abc_MaxInt(local_50,nSuppTotalMin);
          local_50 = Abc_MaxInt(a,nSuppTotalCur);
          nSuppMaxCur = nSuppTotalMin + nSuppTotalCur + nSuppMaxCur;
        }
        if (((nSuppSize1 == -1) || (local_50 < local_4c)) ||
           ((local_4c == local_50 && (nSuppMaxCur < nSuppMaxMin)))) {
          nSuppSize1 = nSuppSize0;
          local_4c = local_50;
          nSuppMaxMin = nSuppMaxCur;
        }
      }
    }
    for (VarBest = 0; VarBest < nTruths; VarBest = VarBest + 1) {
      Kit_TruthCofactor0New
                (ppCofs[VarBest << 1],ppTruths[VarBest],*(uint *)&p->field_0x8 >> 7 & 0x1f,
                 nSuppSize1);
      Kit_TruthCofactor1New
                (ppCofs[VarBest * 2 + 1],ppTruths[VarBest],*(uint *)&p->field_0x8 >> 7 & 0x1f,
                 nSuppSize1);
    }
    return nSuppSize1;
  }
  __assert_fail("nTruths > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                ,0x36,
                "int Lpk_FunComputeMinSuppSizeVar(Lpk_Fun_t *, unsigned int **, int, unsigned int **, unsigned int)"
               );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Cofactors TTs w.r.t. all vars and finds the best var.]

  Description [The best variable is the variable with the minimum 
  sum total of the support sizes of all truth tables. This procedure 
  computes and returns cofactors w.r.t. the best variable.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Lpk_FunComputeMinSuppSizeVar( Lpk_Fun_t * p, unsigned ** ppTruths, int nTruths, unsigned ** ppCofs, unsigned uNonDecSupp )
{
    int i, Var, VarBest, nSuppSize0, nSuppSize1;
    int nSuppTotalMin = -1; // Suppress "might be used uninitialized"
    int nSuppTotalCur;
    int nSuppMaxMin = -1; // Suppress "might be used uninitialized"
    int nSuppMaxCur;
    assert( nTruths > 0 );
    VarBest = -1;
    Lpk_SuppForEachVar( p->uSupp, Var )
    {
        if ( (uNonDecSupp & (1 << Var)) == 0 )
            continue;
        nSuppMaxCur = 0;
        nSuppTotalCur = 0;
        for ( i = 0; i < nTruths; i++ )
        {
            if ( nTruths == 1 )
            {
                nSuppSize0 = Kit_WordCountOnes( p->puSupps[2*Var+0] );
                nSuppSize1 = Kit_WordCountOnes( p->puSupps[2*Var+1] );
            }
            else
            {
                Kit_TruthCofactor0New( ppCofs[2*i+0], ppTruths[i], p->nVars, Var );
                Kit_TruthCofactor1New( ppCofs[2*i+1], ppTruths[i], p->nVars, Var );
                nSuppSize0 = Kit_TruthSupportSize( ppCofs[2*i+0], p->nVars );
                nSuppSize1 = Kit_TruthSupportSize( ppCofs[2*i+1], p->nVars );
            }        
            nSuppMaxCur = Abc_MaxInt( nSuppMaxCur, nSuppSize0 );
            nSuppMaxCur = Abc_MaxInt( nSuppMaxCur, nSuppSize1 );
            nSuppTotalCur += nSuppSize0 + nSuppSize1;
        }
        if ( VarBest == -1 || nSuppMaxMin > nSuppMaxCur ||
             (nSuppMaxMin == nSuppMaxCur && nSuppTotalMin > nSuppTotalCur) )
        {
            VarBest = Var;
            nSuppMaxMin = nSuppMaxCur;
            nSuppTotalMin = nSuppTotalCur;
        }
    }
    // recompute cofactors for the best var
    for ( i = 0; i < nTruths; i++ )
    {
        Kit_TruthCofactor0New( ppCofs[2*i+0], ppTruths[i], p->nVars, VarBest );
        Kit_TruthCofactor1New( ppCofs[2*i+1], ppTruths[i], p->nVars, VarBest );
    }
    return VarBest;
}